

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::whois_cmd(int cid,char **args,int argc)

{
  pointer *this;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  clientinfo *ci_00;
  long lVar5;
  char *pcVar6;
  undefined8 uVar7;
  stringformatter local_1ae0;
  char local_1ad8 [8];
  string s_1;
  exception *e;
  char local_19b8 [8];
  string amsg;
  clientinfo local_18a8;
  stringformatter local_1010;
  char local_1008 [8];
  string msg;
  allocator local_ef9;
  string local_ef8;
  allocator local_ed1;
  string local_ed0;
  allocator<char> local_ea9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_ea8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_ea0;
  undefined1 local_e98 [8];
  string s;
  allocator local_e51;
  string local_e50 [39];
  allocator local_e29;
  string local_e28 [32];
  undefined1 local_e08 [8];
  Response res;
  string local_dc8;
  undefined1 local_da8 [8];
  Request req;
  stringformatter local_d10;
  char local_d08 [8];
  string r_str;
  clientinfo local_bf8;
  string local_360;
  char *local_340;
  char *location;
  char lmsg [3] [255];
  char *ip;
  clientinfo *ci;
  int cn;
  bool usage;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar2 = false;
  bVar3 = QServ::getlastSA(&qs);
  if (bVar3) {
    ci._4_4_ = atoi(args[1]);
    if ((ci._4_4_ < 0) || (1000 < ci._4_4_)) {
      bVar2 = true;
      goto LAB_0018c076;
    }
  }
  else {
    ci._4_4_ = QServ::getSender(&qs);
  }
  ci_00 = QServ::getClient(&qs,ci._4_4_);
  if (ci_00 == (clientinfo *)0x0) {
    iVar4 = QServ::getSender(&qs);
    sendf(iVar4,1,"ris",0x23,"\f3Error: Player not connected");
  }
  else if ((ci_00->connected & 1U) != 0) {
    register0x00000000 = QServ::cntoip(&qs,ci._4_4_);
    iVar4 = strcmp("127.0.0.1",register0x00000000);
    if (iVar4 == 0) {
      local_340 = "localhost";
    }
    else {
      QServ::cgip_abi_cxx11_(&local_360,&qs,stack0xffffffffffffffc8);
      local_340 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::~string((string *)&local_360);
      if (local_340 == (char *)0x0) {
        sprintf(lmsg[0] + 0xf7,"%s","Unknown Location");
      }
    }
    if (local_340 != (char *)0x0) {
      sprintf(lmsg[0] + 0xf7,"%s",local_340);
    }
    QServ::getlastCI(&local_bf8,&qs);
    if (local_bf8.privilege == 3) {
      sprintf((char *)&location,"%s (%s)",lmsg[0] + 0xf7,stack0xffffffffffffffc8);
    }
    else {
      sprintf((char *)&location,"%s",lmsg[0] + 0xf7);
    }
    clientinfo::~clientinfo(&local_bf8);
    if ((qs.enable_HTTP_geo & 1U) == 0) {
      stringformatter::stringformatter(&local_1ae0,local_1ad8);
      pcVar6 = colorname(ci_00);
      stringformatter::operator()
                (&local_1ae0,"Name: \f0%s \f7CN: \f1%d \f7Location: \f2%s",pcVar6,
                 (ulong)(uint)ci_00->clientnum,&location);
      iVar4 = QServ::getSender(&qs);
      sendf(iVar4,1,"ris",0x23,local_1ad8);
    }
    else {
      stringformatter::stringformatter(&local_d10,local_d08);
      stringformatter::operator()
                (&local_d10,"%s%s%s","http://ip-api.com/line/",stack0xffffffffffffffc8,
                 "?fields=city,regionName,country");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_dc8,local_d08,
                 (allocator *)
                 ((long)&res.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      http::Request::Request((Request *)local_da8,&local_dc8,V4);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&res.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e28,"GET",&local_e29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e50,"",&local_e51);
      s.field_2._8_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(&s.field_2._M_allocated_capacity + 1));
      http::Request::send((Request *)local_e08,(int)local_da8,local_e28,(size_t)local_e50,
                          (int)(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(&s.field_2._M_allocated_capacity + 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&s.field_2 + 8));
      std::__cxx11::string::~string(local_e50);
      std::allocator<char>::~allocator((allocator<char> *)&local_e51);
      std::__cxx11::string::~string(local_e28);
      std::allocator<char>::~allocator((allocator<char> *)&local_e29);
      this = &res.headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_ea0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
      local_ea8._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((string *)local_e98,local_ea0,local_ea8,&local_ea9);
      std::allocator<char>::~allocator(&local_ea9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ed0,"\n",&local_ed1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ef8," > ",&local_ef9);
      ::RString((string *)local_e98,&local_ed0,&local_ef8);
      std::__cxx11::string::~string((string *)&local_ef8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
      std::__cxx11::string::~string((string *)&local_ed0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
      ::UTFEncode((string *)local_e98);
      lVar5 = std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)local_e98,lVar5 - 2);
      stringformatter::stringformatter(&local_1010,local_1008);
      pcVar6 = colorname(ci_00);
      uVar1 = ci_00->clientnum;
      uVar7 = std::__cxx11::string::c_str();
      stringformatter::operator()
                (&local_1010,"Name: \f0%s \f7CN: \f1%d \f7Location: \f6%s",pcVar6,(ulong)uVar1,uVar7
                );
      iVar4 = QServ::getSender(&qs);
      sendf(iVar4,1,"ris",0x23,local_1008);
      QServ::getlastCI(&local_18a8,&qs);
      clientinfo::~clientinfo(&local_18a8);
      if (local_18a8.privilege == 3) {
        stringformatter::stringformatter((stringformatter *)&e,local_19b8);
        stringformatter::operator()((stringformatter *)&e,"IP: \f2%s",stack0xffffffffffffffc8);
        iVar4 = QServ::getSender(&qs);
        sendf(iVar4,1,"ris",0x23,local_19b8);
      }
      std::__cxx11::string::~string((string *)local_e98);
      http::Response::~Response((Response *)local_e08);
      http::Request::~Request((Request *)local_da8);
    }
  }
LAB_0018c076:
  if (bVar2) {
    iVar4 = QServ::getSender(&qs);
    pcVar6 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar4,1,"ris",0x23,pcVar6);
  }
  return;
}

Assistant:

QSERV_CALLBACK whois_cmd(p) {
        #include <stdio.h>

        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    sendinfo:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            char *ip = toip(cn), lmsg[3][255];
                            const char *location;

                            if(!strcmp("127.0.0.1", ip)) {
                                location = (char*)"localhost";
                            } else {
                                location = qs.cgip(ip).c_str(); //qs.congeoip(ip); <-- just country

                                if(!location) {
                                    sprintf(lmsg[1], "%s", "Unknown Location");
                                }
                            }
                            if(location) sprintf(lmsg[1], "%s", location);
                            (CMD_SCI.privilege == PRIV_ADMIN) ? sprintf(lmsg[0], "%s (%s)", lmsg[1], ip) : sprintf(lmsg[0], "%s", lmsg[1]);
                            if(qs.enable_HTTP_geo) {
                                try
                                {
                                    defformatstring(r_str)("%s%s%s", "http://ip-api.com/line/", ip, "?fields=city,regionName,country");
                                    http::Request req(r_str);
                                    const http::Response res = req.send("GET");
                                    std::string s(res.body.begin(), res.body.end());
                                    RString(s, "\n", " > ");
                                    UTFEncode(s);
                                    s.erase(s.length()-2, 2);
                                    defformatstring(msg)("Name: \f0%s \f7CN: \f1%d \f7Location: \f6%s", colorname(ci), ci->clientnum, s.c_str());
                                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
                                    if(CMD_SCI.privilege == PRIV_ADMIN){
                                        defformatstring(amsg)("IP: \f2%s", ip);
                                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, amsg);
                                    }
                                }
                                catch (const std::exception& e)
                                {
                                    std::cerr << "HTTP geolocation localhost connect or failed with: " << e.what() << '\n';
                                }
                            }
                            else {
                                 defformatstring(s)("Name: \f0%s \f7CN: \f1%d \f7Location: \f2%s",colorname(ci), ci->clientnum,lmsg[0]);
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, s);
                            }
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto sendinfo;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }